

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::resetFlowAndLoss(Graph *this)

{
  Edge *local_20;
  Edge *e;
  Vertex *v;
  Graph *this_local;
  
  for (e = (Edge *)this->verticesList; e != (Edge *)0x0; e = (Edge *)Vertex::getNext((Vertex *)e)) {
    for (local_20 = Vertex::getEdgesList((Vertex *)e); local_20 != (Edge *)0x0;
        local_20 = Edge::getNext(local_20)) {
      Edge::setActiveFlow(local_20,0.0);
      Edge::setReactiveFlow(local_20,0.0);
      Edge::setActiveLoss(local_20,0.0);
      Edge::setReactiveLoss(local_20,0.0);
    }
  }
  return;
}

Assistant:

void Graph::resetFlowAndLoss(){
    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
        for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);
        }
    }
}